

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawVert *pIVar4;
  ImGuiContext *pIVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImDrawList *this;
  bool bVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  ImVec4 *buf_00;
  int iVar15;
  unsigned_short *puVar16;
  ImGuiContext *g;
  int iVar17;
  ImDrawCmd *pIVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ImRect vtxs_rect;
  ImGuiListClipper clipper;
  char buf [300];
  ImVec2 local_1c8;
  ImVec2 IStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [12];
  undefined8 uStack_1a4;
  uint local_19c;
  ImDrawList *local_198;
  ulong local_190;
  uint local_184;
  ImDrawCmd *local_180;
  ImGuiContext *local_178;
  ImVec2 local_170;
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pcVar14 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar14 = draw_list->_OwnerName;
  }
  bVar8 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar14,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,(draw_list->CmdBuffer).Size);
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->DrawList == draw_list) {
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar5->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar8) {
      return;
    }
  }
  else {
    local_198 = &pIVar5->ForegroundDrawList;
    if ((window != (ImGuiWindow *)0x0) && (bVar9 = IsItemHovered(0), bVar9)) {
      local_168[0].y = (window->Pos).y + (window->Size).y;
      local_168[0].x = (window->Pos).x + (window->Size).x;
      ImDrawList::AddRect(local_198,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
    }
    if (!bVar8) {
      return;
    }
    if ((window != (ImGuiWindow *)0x0) && (window->WasActive == false)) {
      Text("(Note: owning Window is inactive: DrawList is not being rendered!)");
    }
    if (0 < (draw_list->CmdBuffer).Size) {
      pIVar18 = (draw_list->CmdBuffer).Data;
      iVar15 = 0;
      local_178 = pIVar5;
      do {
        if (pIVar18->UserCallback == (ImDrawCallback)0x0) {
          if (pIVar18->ElemCount != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              puVar16 = (unsigned_short *)0x0;
            }
            else {
              puVar16 = (draw_list->IdxBuffer).Data;
            }
            ImFormatString((char *)local_168,300,
                           "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           SUB84((double)(pIVar18->ClipRect).x,0),
                           SUB84((double)(pIVar18->ClipRect).y,0),(double)(pIVar18->ClipRect).z,
                           (double)(pIVar18->ClipRect).w,(ulong)pIVar18->ElemCount / 3,
                           pIVar18->TextureId);
            cVar10 = TreeNode((void *)(((long)pIVar18 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                      0x6db6db6db6db6db7),"%s",local_168);
            if ((show_drawcmd_clip_rects == true) &&
               (bVar8 = IsItemHovered(0), this = local_198, bVar8)) {
              local_190 = CONCAT71(local_190._1_7_,cVar10);
              local_1b0._0_4_ = (pIVar18->ClipRect).x;
              local_1b0._4_4_ = (pIVar18->ClipRect).y;
              local_1b0._8_4_ = (pIVar18->ClipRect).z;
              fVar1 = (pIVar18->ClipRect).w;
              uStack_1a4._0_4_ = (int)fVar1;
              local_1c8.x = 3.4028235e+38;
              local_1c8.y = 3.4028235e+38;
              IVar6 = local_1c8;
              IStack_1c0.x = -3.4028235e+38;
              IStack_1c0.y = -3.4028235e+38;
              IVar7 = IStack_1c0;
              if (0 < (int)pIVar18->ElemCount) {
                IStack_1c0.y = -3.4028235e+38;
                IStack_1c0.x = -3.4028235e+38;
                local_1c8.x = 3.4028235e+38;
                local_1c8.y = 3.4028235e+38;
                lVar13 = (long)iVar15;
                fVar19 = IStack_1c0.y;
                fVar20 = IStack_1c0.x;
                fVar21 = local_1c8.x;
                fVar22 = local_1c8.y;
                local_1c8 = IVar6;
                IStack_1c0 = IVar7;
                do {
                  if (puVar16 == (unsigned_short *)0x0) {
                    uVar12 = (uint)lVar13;
                  }
                  else {
                    uVar12 = (uint)puVar16[lVar13];
                  }
                  if ((draw_list->VtxBuffer).Size <= (int)uVar12) {
LAB_00120de3:
                    __assert_fail("i < Size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                                  ,0x4e6,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]"
                                 );
                  }
                  pIVar4 = (draw_list->VtxBuffer).Data;
                  fVar2 = pIVar4[(int)uVar12].pos.x;
                  if (fVar2 < fVar21) {
                    local_1c8.x = fVar2;
                    fVar21 = fVar2;
                  }
                  pIVar4 = pIVar4 + (int)uVar12;
                  fVar2 = (pIVar4->pos).y;
                  if (fVar2 < fVar22) {
                    local_1c8.y = fVar2;
                    fVar22 = fVar2;
                  }
                  fVar2 = (pIVar4->pos).x;
                  if (fVar20 < fVar2) {
                    IStack_1c0.x = fVar2;
                    fVar20 = fVar2;
                  }
                  fVar2 = (pIVar4->pos).y;
                  if (fVar19 < fVar2) {
                    IStack_1c0.y = fVar2;
                    fVar19 = fVar2;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 < (int)(pIVar18->ElemCount + iVar15));
              }
              local_1b0._0_4_ = (undefined4)(int)(float)local_1b0._0_4_;
              local_1b0._8_4_ = (undefined4)(int)(float)local_1b0._8_4_;
              local_1b0._4_4_ = (undefined4)(int)(float)local_1b0._4_4_;
              uStack_1a4._0_4_ = (int)(float)(int)fVar1;
              ImDrawList::AddRect(local_198,(ImVec2 *)local_1b0,(ImVec2 *)(local_1b0 + 8),0xffff00ff
                                  ,0.0,0xf,1.0);
              local_1c8.y = (float)(int)local_1c8.y;
              local_1c8.x = (float)(int)local_1c8.x;
              IStack_1c0.y = (float)(int)IStack_1c0.y;
              IStack_1c0.x = (float)(int)IStack_1c0.x;
              ImDrawList::AddRect(this,&local_1c8,&IStack_1c0,0xff00ffff,0.0,0xf,1.0);
              cVar10 = (char)local_190;
            }
            if (cVar10 != '\0') {
              Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d",
                   (ulong)pIVar18->ElemCount,(ulong)pIVar18->ElemCount / 3,(ulong)pIVar18->VtxOffset
                   ,(ulong)pIVar18->IdxOffset);
              local_1b0._0_4_ = (GImGui->CurrentWindow->DC).CursorPos.y;
              local_1b0._4_4_ = -1.0;
              local_1b0._8_4_ = pIVar18->ElemCount / 3;
              uStack_1a4._0_4_ = 0;
              uStack_1a4._4_4_ = -1;
              local_19c = 0xffffffff;
              local_180 = pIVar18;
              while (bVar8 = ImGuiListClipper::Step((ImGuiListClipper *)local_1b0), bVar8) {
                local_184 = local_19c;
                if ((int)uStack_1a4._4_4_ < (int)local_19c) {
                  iVar17 = uStack_1a4._4_4_ * 3 + iVar15;
                  uVar12 = uStack_1a4._4_4_;
                  do {
                    local_190 = (ulong)uVar12;
                    local_1c8.x = 0.0;
                    local_1c8.y = 0.0;
                    IStack_1c0.x = 0.0;
                    IStack_1c0.y = 0.0;
                    local_1b8 = 0;
                    lVar13 = 0;
                    buf_00 = local_168;
                    do {
                      if (puVar16 == (unsigned_short *)0x0) {
                        uVar12 = iVar17 + (int)lVar13;
                      }
                      else {
                        uVar12 = (uint)puVar16[iVar17 + lVar13];
                      }
                      if ((draw_list->VtxBuffer).Size <= (int)uVar12) goto LAB_00120de3;
                      pIVar4 = (draw_list->VtxBuffer).Data;
                      (&local_1c8)[lVar13] = pIVar4[(int)uVar12].pos;
                      pcVar14 = "    ";
                      if (lVar13 == 0) {
                        pcVar14 = "elem";
                      }
                      iVar11 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                              "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                              ,SUB84((double)pIVar4[(int)uVar12].pos.x,0),
                                              SUB84((double)pIVar4[(int)uVar12].pos.y,0),
                                              (double)pIVar4[(int)uVar12].uv.x,
                                              (double)pIVar4[(int)uVar12].uv.y,pcVar14,
                                              (ulong)(uint)(iVar17 + (int)lVar13),
                                              (ulong)pIVar4[(int)uVar12].col);
                      buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar11);
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 3);
                    local_170.x = 0.0;
                    local_170.y = 0.0;
                    Selectable((char *)local_168,false,0,&local_170);
                    pIVar5 = local_178;
                    bVar8 = IsItemHovered(0);
                    if (bVar8) {
                      uVar12 = (pIVar5->ForegroundDrawList).Flags;
                      (pIVar5->ForegroundDrawList).Flags = uVar12 & 0xfffffffe;
                      ImDrawList::AddPolyline(local_198,&local_1c8,3,0xff00ffff,true,1.0);
                      (pIVar5->ForegroundDrawList).Flags = uVar12;
                    }
                    iVar17 = iVar17 + 3;
                    uVar12 = (int)local_190 + 1;
                  } while (uVar12 != local_184);
                }
              }
              TreePop();
              pIVar18 = local_180;
              if ((float)local_1b0._8_4_ != -NAN) {
                __assert_fail("ItemsCount == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                              ,0x6b8,"ImGuiListClipper::~ImGuiListClipper()");
              }
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar18->UserCallback,pIVar18->UserCallbackData);
        }
        iVar15 = iVar15 + pIVar18->ElemCount;
        pIVar18 = pIVar18 + 1;
      } while (pIVar18 < (draw_list->CmdBuffer).Data + (draw_list->CmdBuffer).Size);
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::Text("(Note: owning Window is inactive: DrawList is not being rendered!)");

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,0,255,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGui::Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d", pcmd->ElemCount, pcmd->ElemCount/3, pcmd->VtxOffset, pcmd->IdxOffset);
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "elem" : "    ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }